

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphel1d.cpp
# Opt level: O0

int __thiscall TPZGraphEl1d::ExportType(TPZGraphEl1d *this,TPZDrawStyle st)

{
  TPZDrawStyle st_local;
  TPZGraphEl1d *this_local;
  undefined4 local_4;
  
  if (st == EVTKStyle) {
    local_4 = 1;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int TPZGraphEl1d::ExportType(TPZDrawStyle st){
	switch(st)
	{
		case(EVTKStyle):
			return 1;
			//		break;
		default:
			return -1;
	}
	//	return -1;
}